

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

string * __thiscall
lest::to_string<void(S::*)(),void(S::*)()>
          (string *__return_storage_ptr__,lest *this,offset_in_S_to_subr *lhs,string *op,
          offset_in_S_to_subr *rhs)

{
  ostream *poVar1;
  string local_200;
  lest *local_1d0;
  offset_in_S_to_subr local_1c8;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream os;
  offset_in_S_to_subr *rhs_local;
  string *op_local;
  offset_in_S_to_subr *lhs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1d0 = *(lest **)this;
  local_1c8 = *(offset_in_S_to_subr *)(this + 8);
  to_string<S,void()>(&local_1c0,local_1d0,local_1c8);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string<S,void()>(&local_200,*(lest **)op,op->_M_string_length);
  std::operator<<(poVar1,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}